

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

void mwLogFile(char *name)

{
  FILE *pFVar1;
  FILE *__stream;
  time_t tid;
  time_t local_10;
  
  time(&local_10);
  pFVar1 = mwLogR();
  if (pFVar1 != (FILE *)0x0) {
    __stream = (FILE *)mwLogR();
    fclose(__stream);
    mwLogB2 = (FILE *)0x0;
    mwLogB1 = (FILE *)0x0;
    mwLog = (FILE *)0x0;
  }
  if (name != (char *)0x0) {
    mwLog = (FILE *)fopen(name,"a");
    mwLogB1 = mwLog;
    mwLogB2 = mwLog;
    pFVar1 = mwLogR();
    if (pFVar1 == (FILE *)0x0) {
      mwWrite("logfile: failed to open/create file \'%s\'\n",name);
    }
  }
  return;
}

Assistant:

static void mwLogFile(const char *name)
{
	time_t tid;
	(void) time(&tid);
	if (mwLogR() != NULL) {
		fclose(mwLogR());
		mwLogW(NULL);
	}
	if (name == NULL) {
		return;
	}
	mwLogW(fopen(name, "a" COMMIT));
	if (mwLogR() == NULL) {
		mwWrite("logfile: failed to open/create file '%s'\n", name);
	}
}